

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O2

size_t __thiscall opengv::math::Sturm::evaluateChain2(Sturm *this,double bound)

{
  undefined1 auVar1 [16];
  size_type __n;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  size_t i;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vector<double,_std::allocator<double>_> signs;
  double local_50;
  vector<double,_std::allocator<double>_> monomials;
  
  monomials.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  monomials.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  monomials.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&monomials,this->_dimension);
  __n = this->_dimension;
  pdVar7 = monomials.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + (__n - 1);
  *pdVar7 = 1.0;
  for (uVar4 = 2; uVar4 <= __n; uVar4 = uVar4 + 1) {
    pdVar7[-1] = bound * *pdVar7;
    pdVar7 = pdVar7 + -1;
  }
  signs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  signs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  signs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&signs,__n);
  uVar4 = this->_dimension;
  lVar9 = 0;
  for (uVar10 = 0; uVar10 < uVar4; uVar10 = uVar10 + 1) {
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&signs,&local_50);
    lVar2 = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    uVar4 = this->_dimension;
    uVar6 = uVar10;
    if (uVar10 < uVar4) {
      uVar6 = uVar4;
    }
    pdVar7 = (double *)
             ((lVar2 + 1) * lVar9 +
             (long)(this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
    uVar8 = uVar10;
    while (uVar6 != uVar8) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *pdVar7;
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           monomials.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8];
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + lVar2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = signs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1];
      auVar1 = vfmadd213sd_fma(auVar12,auVar11,auVar1);
      signs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] = auVar1._0_8_;
    }
    lVar9 = lVar9 + 8;
  }
  bVar3 = 0.0 < *signs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar10 = 1;
  iVar5 = 0;
  do {
    if (uVar4 <= uVar10) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&signs.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&monomials.super__Vector_base<double,_std::allocator<double>_>);
      return (long)iVar5;
    }
    if (bVar3) {
      bVar3 = true;
      if (signs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10] < 0.0) {
        iVar5 = iVar5 + 1;
LAB_0039cdab:
        bVar3 = false;
      }
    }
    else {
      if (signs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10] <= 0.0) goto LAB_0039cdab;
      iVar5 = iVar5 + 1;
      bVar3 = true;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

size_t
opengv::math::Sturm::evaluateChain2( double bound )
{  
  std::vector<double> monomials;
  monomials.resize(_dimension);
  monomials[_dimension-1] = 1.0;
  
  //evaluate all monomials at the bound
  for(size_t i = 2; i <= _dimension; i++)
    monomials[_dimension-i] = monomials[_dimension-i+1]*bound;
  
  std::vector<double> signs;
  signs.reserve(_dimension);
  for( size_t i = 0; i < _dimension; i++ )
  {
    signs.push_back(0.0);
    for( size_t j = i; j < _dimension; j++ )
      signs.back() += _C(i,j) * monomials[j];
  }
  
  bool positive = false;
  if( signs[0] > 0.0 )
    positive = true;
  
  int signChanges = 0;
  
  for( size_t i = 1; i < _dimension; i++ )
  {
    if( positive )
    {
      if( signs[i] < 0.0 )
      {
        signChanges++;
        positive = false;
      }
    }
    else
    {
      if( signs[i] > 0.0 )
      {
        signChanges++;
        positive = true;
      }
    }
  }
  
  return signChanges;
}